

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O2

void allocate_src_var_of_4x4_sub_block_buf(AV1_COMP *cpi)

{
  BLOCK_SIZE BVar1;
  Block4x4VarInfo *pBVar2;
  
  if (((cpi->oxcf).mode == '\x02') &&
     (((cpi->sf).part_sf.partition_search_type == '\0' ||
      ((0.0 < (double)(cpi->oxcf).speed * -0.25 + 1.0 &&
       (((cpi->sf).rt_sf.use_nonrd_pick_mode == 0 || ((cpi->sf).rt_sf.hybrid_intra_pickmode != 0))))
      )))) {
    pBVar2 = (cpi->td).src_var_info_of_4x4_sub_blocks;
    if (pBVar2 == (Block4x4VarInfo *)0x0) {
      BVar1 = ((cpi->common).seq_params)->sb_size;
      pBVar2 = (Block4x4VarInfo *)
               aom_malloc((ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                        [BVar1] *
                                  (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                        [BVar1] * 0x10));
      if (pBVar2 == (Block4x4VarInfo *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate source_variance_info");
      }
      (cpi->td).src_var_info_of_4x4_sub_blocks = pBVar2;
    }
    (cpi->td).mb.src_var_info_of_4x4_sub_blocks = pBVar2;
  }
  return;
}

Assistant:

static inline bool is_src_var_for_4x4_sub_blocks_caching_enabled(
    const AV1_COMP *const cpi) {
  const SPEED_FEATURES *const sf = &cpi->sf;
  if (cpi->oxcf.mode != ALLINTRA) return false;

  if (sf->part_sf.partition_search_type == SEARCH_PARTITION) return true;

  if (INTRA_RD_VAR_THRESH(cpi->oxcf.speed) <= 0 ||
      (sf->rt_sf.use_nonrd_pick_mode && !sf->rt_sf.hybrid_intra_pickmode))
    return false;

  return true;
}